

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_dump(lua_State *L)

{
  int iVar1;
  int iVar2;
  luaL_Buffer b;
  
  iVar1 = lua_toboolean(L,2);
  iVar2 = 1;
  luaL_checktype(L,1,6);
  lua_settop(L,1);
  luaL_buffinit(L,&b);
  iVar1 = lua_dump(L,writer,&b,iVar1);
  if (iVar1 == 0) {
    luaL_pushresult(&b);
  }
  else {
    iVar2 = luaL_error(L,"unable to dump given function");
  }
  return iVar2;
}

Assistant:

static int str_dump(lua_State *L) {
    luaL_Buffer b;
    int strip = lua_toboolean(L, 2);
    luaL_checktype(L, 1, LUA_TFUNCTION);
    lua_settop(L, 1);
    luaL_buffinit(L, &b);
    if (lua_dump(L, writer, &b, strip) != 0)
        return luaL_error(L, "unable to dump given function");
    luaL_pushresult(&b);
    return 1;
}